

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# omptarget.cpp
# Opt level: O3

int __thiscall
DeviceTy::deallocTgtPtr(DeviceTy *this,void *HstPtrBegin,int64_t Size,bool ForceDelete)

{
  size_t *psVar1;
  _List_node_base *p_Var2;
  int iVar3;
  iterator iVar4;
  LookupResult LVar5;
  
  iVar3 = pthread_mutex_lock((pthread_mutex_t *)&this->DataMapMtx);
  if (iVar3 != 0) {
    std::__throw_system_error(iVar3);
  }
  LVar5 = lookupMapping(this,HstPtrBegin,Size);
  iVar4 = LVar5.Entry._M_node;
  if (((undefined1  [16])LVar5 & (undefined1  [16])0x7) == (undefined1  [16])0x0) {
    iVar3 = -1;
  }
  else {
    if (ForceDelete) {
      iVar4._M_node[3]._M_next = (_List_node_base *)0x0;
    }
    else {
      p_Var2 = iVar4._M_node[3]._M_next;
      iVar4._M_node[3]._M_next = (_List_node_base *)((long)&p_Var2[-1]._M_prev + 7);
      iVar3 = 0;
      if (1 < (long)p_Var2) goto LAB_00103284;
    }
    (*this->RTL->data_delete)(this->RTLDeviceID,iVar4._M_node[2]._M_prev);
    psVar1 = &(this->HostDataToTargetMap).
              super__List_base<HostDataToTargetTy,_std::allocator<HostDataToTargetTy>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 - 1;
    std::__detail::_List_node_base::_M_unhook();
    operator_delete(iVar4._M_node);
    iVar3 = 0;
  }
LAB_00103284:
  pthread_mutex_unlock((pthread_mutex_t *)&this->DataMapMtx);
  return iVar3;
}

Assistant:

int DeviceTy::deallocTgtPtr(void *HstPtrBegin, int64_t Size, bool ForceDelete) {
  // Check if the pointer is contained in any sub-nodes.
  int rc;
  DataMapMtx.lock();
  LookupResult lr = lookupMapping(HstPtrBegin, Size);
  if (lr.Flags.IsContained || lr.Flags.ExtendsBefore || lr.Flags.ExtendsAfter) {
    auto &HT = *lr.Entry;
    if (ForceDelete)
      HT.RefCount = 1;
    if (--HT.RefCount <= 0) {
      assert(HT.RefCount == 0 && "did not expect a negative ref count");
      DP("Deleting tgt data " DPxMOD " of size %ld\n",
          DPxPTR(HT.TgtPtrBegin), Size);
      RTL->data_delete(RTLDeviceID, (void *)HT.TgtPtrBegin);
      DP("Removing%s mapping with HstPtrBegin=" DPxMOD ", TgtPtrBegin=" DPxMOD
          ", Size=%ld\n", (ForceDelete ? " (forced)" : ""),
          DPxPTR(HT.HstPtrBegin), DPxPTR(HT.TgtPtrBegin), Size);
      HostDataToTargetMap.erase(lr.Entry);
    }
    rc = OFFLOAD_SUCCESS;
  } else {
    DP("Section to delete (hst addr " DPxMOD ") does not exist in the allocated"
       " memory\n", DPxPTR(HstPtrBegin));
    rc = OFFLOAD_FAIL;
  }

  DataMapMtx.unlock();
  return rc;
}